

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O2

void Cba_NtkCollectDfs_rec(Cba_Ntk_t *p,int iObj,Vec_Int_t *vObjs)

{
  int iVar1;
  int iVar2;
  
  iVar1 = Cba_ObjCopy(p,iObj);
  if (iVar1 != 0) {
    Cba_ObjSetCopy(p,iObj,0);
    iVar1 = Cba_ObjFin0(p,iObj);
    while( true ) {
      iVar2 = Cba_ObjFin0(p,iObj + 1);
      if (iVar2 <= iVar1) break;
      iVar2 = Cba_FinFon(p,iVar1);
      iVar2 = Cba_FonObj(p,iVar2);
      if (iVar2 != 0) {
        Cba_NtkCollectDfs_rec(p,iVar2,vObjs);
      }
      iVar1 = iVar1 + 1;
    }
    Vec_IntPush(vObjs,iObj);
    return;
  }
  return;
}

Assistant:

void Cba_NtkCollectDfs_rec( Cba_Ntk_t * p, int iObj, Vec_Int_t * vObjs )
{
    int iFin, iFanin, k;
    if ( !Cba_ObjCopy(p, iObj) )
        return;
    Cba_ObjSetCopy( p, iObj, 0 );
    Cba_ObjForEachFinFaninReal( p, iObj, iFin, iFanin, k )
        Cba_NtkCollectDfs_rec( p, iFanin, vObjs );
    Vec_IntPush( vObjs, iObj );
}